

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzdohrprecond.h
# Opt level: O0

void __thiscall
TPZDohrPrecondV2SubData<std::complex<double>,_TPZDohrSubstructCondense<std::complex<double>_>_>::
TPZDohrPrecondV2SubData
          (TPZDohrPrecondV2SubData<std::complex<double>,_TPZDohrSubstructCondense<std::complex<double>_>_>
           *this,int subindex,
          TPZAutoPointer<TPZDohrSubstructCondense<std::complex<double>_>_> *substruct,
          TPZAutoPointer<TPZFMatrix<std::complex<double>_>_> *res_local)

{
  TPZFMatrix<std::complex<double>_> *this_00;
  TPZDohrAssembleItem<std::complex<double>_> *in_RCX;
  TPZDohrAssembleItem<std::complex<double>_> *in_RDI;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  TPZAutoPointer<TPZDohrSubstructCondense<std::complex<double>_>_> *in_stack_ffffffffffffffa0;
  TPZDohrAssembleItem<std::complex<double>_> *rval;
  
  rval = in_RDI;
  TPZAutoPointer<TPZDohrSubstructCondense<std::complex<double>_>_>::TPZAutoPointer
            (in_stack_ffffffffffffffa0,
             (TPZAutoPointer<TPZDohrSubstructCondense<std::complex<double>_>_> *)
             CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  TPZAutoPointer<TPZFMatrix<std::complex<double>_>_>::TPZAutoPointer
            ((TPZAutoPointer<TPZFMatrix<std::complex<double>_>_> *)in_stack_ffffffffffffffa0,
             (TPZAutoPointer<TPZFMatrix<std::complex<double>_>_> *)
             CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  TPZAutoPointer<TPZDohrAssembleItem<std::complex<double>_>_>::TPZAutoPointer
            ((TPZAutoPointer<TPZDohrAssembleItem<std::complex<double>_>_> *)in_RDI);
  operator_new(0x98);
  this_00 = TPZAutoPointer<TPZFMatrix<std::complex<double>_>_>::operator->
                      ((TPZAutoPointer<TPZFMatrix<std::complex<double>_>_> *)in_RCX);
  TPZBaseMatrix::Rows((TPZBaseMatrix *)this_00);
  TPZDohrAssembleItem<std::complex<double>_>::TPZDohrAssembleItem
            (in_RCX,(int)((ulong)rval >> 0x20),(int)rval);
  TPZAutoPointer<TPZDohrAssembleItem<std::complex<double>_>_>::operator=
            ((TPZAutoPointer<TPZDohrAssembleItem<std::complex<double>_>_> *)in_RCX,rval);
  return;
}

Assistant:

TPZDohrPrecondV2SubData(int subindex, const TPZAutoPointer<TSubStruct> &substruct, TPZAutoPointer<TPZFMatrix<TVar> > res_local) : fSubStructure(substruct),
	fInput_local(res_local)
	{
		fv2_local = new TPZDohrAssembleItem<TVar>(subindex, res_local->Rows());
	}